

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmSat.c
# Opt level: O3

int Sfm_NtkWindowToSolver(Sfm_Ntk_t *p)

{
  lit *end;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  Vec_Wec_t *pVVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  lit *plVar15;
  ulong uVar16;
  long lVar17;
  timespec ts;
  timespec local_68;
  sat_solver *local_58;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  
  iVar7 = clock_gettime(3,&local_68);
  if (iVar7 < 0) {
    local_40 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_68.tv_nsec._4_4_,(int)local_68.tv_nsec)),8);
    local_40 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) +
               CONCAT44(local_68.tv_sec._4_4_,(int)local_68.tv_sec) * -1000000;
  }
  sat_solver_restart(p->pSat);
  sat_solver_setnvars(p->pSat,p->vRoots->nSize + p->vOrder->nSize + p->vTfo->nSize + 0xb);
  iVar7 = p->nSatVars;
  if (1 < iVar7) {
    lVar13 = 1;
    do {
      if ((p->vVar2Id).nSize <= lVar13) goto LAB_00535260;
      piVar4 = (p->vVar2Id).pArray;
      uVar1 = piVar4[lVar13];
      uVar16 = (ulong)uVar1;
      if (uVar16 != 0xffffffff) {
        if (((int)uVar1 < 0) || ((p->vId2Var).nSize <= (int)uVar1)) goto LAB_00535260;
        piVar5 = (p->vId2Var).pArray;
        if (piVar5[uVar16] < 1) goto LAB_005352fb;
        piVar5[uVar16] = -1;
        if ((p->vVar2Id).nSize <= lVar13) goto LAB_005352bd;
        piVar4[lVar13] = -1;
        iVar7 = p->nSatVars;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar7);
  }
  p->nSatVars = 1;
  pVVar9 = p->vOrder;
  if (0 < pVVar9->nSize) {
    piVar4 = pVVar9->pArray;
    lVar13 = 0;
    do {
      iVar7 = piVar4[lVar13];
      lVar14 = (long)iVar7;
      uVar1 = p->nSatVars;
      p->nSatVars = uVar1 + 1;
      if ((lVar14 < 0) || ((p->vId2Var).nSize <= iVar7)) goto LAB_00535260;
      piVar5 = (p->vId2Var).pArray;
      if (piVar5[lVar14] != -1) goto LAB_005352dc;
      piVar5[lVar14] = uVar1;
      if (((int)uVar1 < 0) || ((p->vVar2Id).nSize <= (int)uVar1)) goto LAB_005352bd;
      (p->vVar2Id).pArray[uVar1] = iVar7;
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar9->nSize);
  }
  p->vDivVars->nSize = 0;
  pVVar11 = p->vDivs;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar13];
      if (((long)iVar7 < 0) || ((p->vId2Var).nSize <= iVar7)) goto LAB_00535260;
      iVar7 = (p->vId2Var).pArray[iVar7];
      if (iVar7 < 1) goto LAB_0053527f;
      Vec_IntPush(p->vDivVars,iVar7);
      lVar13 = lVar13 + 1;
      pVVar11 = p->vDivs;
    } while (lVar13 < pVVar11->nSize);
    pVVar9 = p->vOrder;
  }
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      uVar1 = pVVar9->pArray[lVar13];
      if (p->nPis <= (int)uVar1) {
        p->vFaninMap->nSize = 0;
        if (((int)uVar1 < 0) || ((p->vFanins).nSize <= (int)uVar1)) goto LAB_0053529e;
        lVar14 = 0;
        while (pVVar9 = (p->vFanins).pArray, lVar14 < pVVar9[uVar1].nSize) {
          iVar7 = pVVar9[uVar1].pArray[lVar14];
          if (((long)iVar7 < 0) || ((p->vId2Var).nSize <= iVar7)) goto LAB_00535260;
          iVar7 = (p->vId2Var).pArray[iVar7];
          if (iVar7 < 1) goto LAB_0053527f;
          Vec_IntPush(p->vFaninMap,iVar7);
          lVar14 = lVar14 + 1;
          if ((p->vFanins).nSize <= (int)uVar1) goto LAB_0053529e;
        }
        if ((p->vId2Var).nSize <= (int)uVar1) goto LAB_00535260;
        iVar7 = (p->vId2Var).pArray[uVar1];
        if (iVar7 < 1) goto LAB_0053527f;
        Vec_IntPush(p->vFaninMap,iVar7);
        if (p->vCnfs->nSize <= (int)uVar1) goto LAB_0053529e;
        Sfm_TranslateCnf(p->vClauses,(Vec_Str_t *)(p->vCnfs->pArray + uVar1),p->vFaninMap,-1);
        pVVar10 = p->vClauses;
        if (0 < pVVar10->nSize) {
          lVar14 = 8;
          lVar17 = 0;
          do {
            lVar12 = (long)*(int *)((long)pVVar10->pArray + lVar14 + -4);
            if (lVar12 == 0) break;
            plVar15 = *(lit **)((long)&pVVar10->pArray->nCap + lVar14);
            iVar7 = sat_solver_addclause(p->pSat,plVar15,plVar15 + lVar12);
            if (iVar7 == 0) {
              return 0;
            }
            lVar17 = lVar17 + 1;
            pVVar10 = p->vClauses;
            lVar14 = lVar14 + 0x10;
          } while (lVar17 < pVVar10->nSize);
        }
      }
      lVar13 = lVar13 + 1;
      pVVar9 = p->vOrder;
    } while (lVar13 < pVVar9->nSize);
  }
  pVVar9 = p->vTfo;
  if (0 < pVVar9->nSize) {
    if (p->pPars->nTfoLevMax < 1) {
      __assert_fail("p->pPars->nTfoLevMax > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmSat.c"
                    ,100,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
    }
    pVVar11 = p->vRoots;
    if (pVVar11->nSize < 1) {
      __assert_fail("Vec_IntSize(p->vRoots) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmSat.c"
                    ,0x65,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
    }
    if (*pVVar9->pArray == p->iPivotNode) {
      __assert_fail("Vec_IntEntry(p->vTfo, 0) != p->iPivotNode",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmSat.c"
                    ,0x66,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
    }
    p->vLits->nSize = 0;
    if (0 < pVVar11->nSize) {
      lVar13 = 0;
      do {
        iVar7 = pVVar11->pArray[lVar13];
        if (((long)iVar7 < 0) || ((p->vId2Var).nSize <= iVar7)) goto LAB_00535260;
        iVar7 = (p->vId2Var).pArray[iVar7];
        if (iVar7 < 1) goto LAB_0053527f;
        Vec_IntPush(p->vLits,iVar7);
        lVar13 = lVar13 + 1;
        pVVar11 = p->vRoots;
      } while (lVar13 < pVVar11->nSize);
      pVVar9 = p->vTfo;
    }
    if (0 < pVVar9->nSize) {
      piVar4 = pVVar9->pArray;
      lVar13 = 0;
      do {
        iVar7 = piVar4[lVar13];
        lVar14 = (long)iVar7;
        if ((lVar14 < 0) || (uVar1 = (p->vId2Var).nSize, (int)uVar1 <= iVar7)) goto LAB_00535260;
        piVar5 = (p->vId2Var).pArray;
        iVar8 = piVar5[lVar14];
        lVar17 = (long)iVar8;
        if (lVar17 < 1) goto LAB_0053527f;
        if ((p->vVar2Id).nSize <= iVar8) goto LAB_00535260;
        piVar6 = (p->vVar2Id).pArray;
        lVar12 = (long)piVar6[lVar17];
        if ((lVar12 < 0) || (uVar1 <= (uint)piVar6[lVar17])) goto LAB_00535260;
        if (piVar5[lVar12] < 1) {
LAB_005352fb:
          __assert_fail("Vec_IntEntry(&p->vId2Var, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmInt.h"
                        ,0xa9,"void Sfm_ObjCleanSatVar(Sfm_Ntk_t *, int)");
        }
        piVar5[lVar12] = -1;
        if ((p->vVar2Id).nSize <= iVar8) goto LAB_005352bd;
        piVar6[lVar17] = -1;
        iVar8 = (p->vId2Var).nSize;
        uVar1 = p->nSatVars;
        p->nSatVars = uVar1 + 1;
        if (iVar8 <= iVar7) goto LAB_00535260;
        if (piVar5[lVar14] != -1) {
LAB_005352dc:
          __assert_fail("Vec_IntEntry(&p->vId2Var, iObj) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmInt.h"
                        ,0xa8,"void Sfm_ObjSetSatVar(Sfm_Ntk_t *, int, int)");
        }
        piVar5[lVar14] = uVar1;
        if (((int)uVar1 < 0) || ((p->vVar2Id).nSize <= (int)uVar1)) goto LAB_005352bd;
        piVar6[uVar1] = iVar7;
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar9->nSize);
      if (0 < pVVar9->nSize) {
        lVar13 = 0;
        do {
          uVar1 = pVVar9->pArray[lVar13];
          if (((int)uVar1 < p->nPis) || (p->nObjs <= (int)(p->nPos + uVar1))) {
            __assert_fail("Sfm_ObjIsNode(p, iNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmSat.c"
                          ,0x74,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
          }
          p->vFaninMap->nSize = 0;
          if (((int)uVar1 < 0) || ((p->vFanins).nSize <= (int)uVar1)) {
LAB_0053529e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          lVar14 = 0;
          while (pVVar9 = (p->vFanins).pArray, lVar14 < pVVar9[uVar1].nSize) {
            iVar7 = pVVar9[uVar1].pArray[lVar14];
            if (((long)iVar7 < 0) || ((p->vId2Var).nSize <= iVar7)) goto LAB_00535260;
            iVar7 = (p->vId2Var).pArray[iVar7];
            if (iVar7 < 1) goto LAB_0053527f;
            Vec_IntPush(p->vFaninMap,iVar7);
            lVar14 = lVar14 + 1;
            if ((p->vFanins).nSize <= (int)uVar1) goto LAB_0053529e;
          }
          if ((p->vId2Var).nSize <= (int)uVar1) goto LAB_00535260;
          iVar7 = (p->vId2Var).pArray[uVar1];
          if (iVar7 < 1) goto LAB_0053527f;
          Vec_IntPush(p->vFaninMap,iVar7);
          if (p->vCnfs->nSize <= (int)uVar1) goto LAB_0053529e;
          iVar7 = p->iPivotNode;
          if (((long)iVar7 < 0) || ((p->vId2Var).nSize <= iVar7)) goto LAB_00535260;
          iVar7 = (p->vId2Var).pArray[iVar7];
          if (iVar7 < 1) goto LAB_0053527f;
          Sfm_TranslateCnf(p->vClauses,(Vec_Str_t *)(p->vCnfs->pArray + uVar1),p->vFaninMap,iVar7);
          pVVar10 = p->vClauses;
          if (0 < pVVar10->nSize) {
            lVar14 = 8;
            lVar17 = 0;
            do {
              lVar12 = (long)*(int *)((long)pVVar10->pArray + lVar14 + -4);
              if (lVar12 == 0) break;
              plVar15 = *(lit **)((long)&pVVar10->pArray->nCap + lVar14);
              iVar7 = sat_solver_addclause(p->pSat,plVar15,plVar15 + lVar12);
              if (iVar7 == 0) {
                return 0;
              }
              lVar17 = lVar17 + 1;
              pVVar10 = p->vClauses;
              lVar14 = lVar14 + 0x10;
            } while (lVar17 < pVVar10->nSize);
          }
          lVar13 = lVar13 + 1;
          pVVar9 = p->vTfo;
        } while (lVar13 < pVVar9->nSize);
        pVVar11 = p->vRoots;
      }
    }
    pVVar9 = p->vLits;
    if (pVVar11->nSize < 1) {
      plVar15 = pVVar9->pArray;
    }
    else {
      end = (lit *)((long)&local_68.tv_nsec + 4);
      lVar13 = 0;
      do {
        if (pVVar9->nSize <= lVar13) {
LAB_00535260:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar1 = pVVar11->pArray[lVar13];
        if (((int)uVar1 < 0) || ((p->vId2Var).nSize <= (int)uVar1)) goto LAB_00535260;
        uVar1 = (p->vId2Var).pArray[uVar1];
        if ((int)uVar1 < 1) {
LAB_0053527f:
          __assert_fail("Vec_IntEntry(&p->vId2Var, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmInt.h"
                        ,0xa7,"int Sfm_ObjSatVar(Sfm_Ntk_t *, int)");
        }
        local_58 = p->pSat;
        uVar2 = pVVar9->pArray[lVar13];
        uVar3 = p->nSatVars;
        p->nSatVars = uVar3 + 1;
        local_38 = lVar13;
        if ((int)(uVar1 | uVar2 | uVar3) < 0) {
          __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0x1a8,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_68.tv_sec._0_4_ = uVar2 * 2 + 1;
        local_68.tv_sec._4_4_ = uVar1 * 2 + 1;
        local_68.tv_nsec._0_4_ = uVar3 * 2 + 1;
        local_4c = (int)local_68.tv_nsec;
        local_48 = local_68.tv_sec._4_4_;
        local_44 = (int)local_68.tv_sec;
        iVar7 = sat_solver_addclause(local_58,(lit *)&local_68,end);
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0x1ae,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_68.tv_sec._0_4_ = local_44;
        local_68.tv_sec._4_4_ = uVar1 * 2;
        local_68.tv_nsec._0_4_ = uVar3 * 2;
        iVar7 = sat_solver_addclause(local_58,(lit *)&local_68,end);
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0x1b4,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_68.tv_sec._4_4_ = local_48;
        local_68.tv_sec._0_4_ = uVar2 * 2;
        local_68.tv_nsec._0_4_ = uVar3 * 2;
        iVar7 = sat_solver_addclause(local_58,(lit *)&local_68,end);
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0x1ba,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_68.tv_nsec._0_4_ = local_4c;
        local_68.tv_sec._0_4_ = uVar2 * 2;
        local_68.tv_sec._4_4_ = uVar1 * 2;
        iVar7 = sat_solver_addclause(local_58,(lit *)&local_68,end);
        if (iVar7 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0x1c0,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        if (p->nSatVars < 1) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        pVVar9 = p->vLits;
        if (pVVar9->nSize <= local_38) {
LAB_005352bd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        plVar15 = pVVar9->pArray;
        plVar15[local_38] = p->nSatVars * 2 + -2;
        lVar13 = local_38 + 1;
        pVVar11 = p->vRoots;
      } while (lVar13 < pVVar11->nSize);
    }
    iVar7 = sat_solver_addclause(p->pSat,plVar15,plVar15 + pVVar9->nSize);
    if (iVar7 == 0) {
      return 0;
    }
  }
  iVar7 = sat_solver_simplify(p->pSat);
  iVar8 = clock_gettime(3,&local_68);
  if (iVar8 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = CONCAT44(local_68.tv_nsec._4_4_,(int)local_68.tv_nsec) / 1000 +
             CONCAT44(local_68.tv_sec._4_4_,(int)local_68.tv_sec) * 1000000;
  }
  p->timeCnf = p->timeCnf + lVar13 + local_40;
  return iVar7;
}

Assistant:

int Sfm_NtkWindowToSolver( Sfm_Ntk_t * p )
{
    // p->vOrder contains all variables in the window in a good order
    // p->vDivs is a subset of nodes in p->vOrder used as divisor candidates
    // p->vTfo contains TFO of the node (does not include node)
    // p->vRoots contains roots of the TFO of the node (may include node)
    Vec_Int_t * vClause;
    int RetValue, iNode = -1, iFanin, i, k;
    abctime clk = Abc_Clock();
//    if ( p->pSat )
//        printf( "%d  ", p->pSat->stats.learnts );
    sat_solver_restart( p->pSat );
    sat_solver_setnvars( p->pSat, 1 + Vec_IntSize(p->vOrder) + Vec_IntSize(p->vTfo) + Vec_IntSize(p->vRoots) + 10 );
    // create SAT variables
    Sfm_NtkCleanVars( p );
    p->nSatVars = 1;
    Vec_IntForEachEntry( p->vOrder, iNode, i )
        Sfm_ObjSetSatVar( p, iNode, p->nSatVars++ );
    // collect divisor variables
    Vec_IntClear( p->vDivVars );
    Vec_IntForEachEntry( p->vDivs, iNode, i )
        Vec_IntPush( p->vDivVars, Sfm_ObjSatVar(p, iNode) );
    // add CNF clauses for the TFI
    Vec_IntForEachEntry( p->vOrder, iNode, i )
    {
        if ( Sfm_ObjIsPi(p, iNode) )
            continue;
        // collect fanin variables
        Vec_IntClear( p->vFaninMap );
        Sfm_ObjForEachFanin( p, iNode, iFanin, k )
            Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iFanin) );
        Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iNode) );
        // generate CNF 
        Sfm_TranslateCnf( p->vClauses, (Vec_Str_t *)Vec_WecEntry(p->vCnfs, iNode), p->vFaninMap, -1 );
        // add clauses
        Vec_WecForEachLevel( p->vClauses, vClause, k )
        {
            if ( Vec_IntSize(vClause) == 0 )
                break;
            RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause) );
            if ( RetValue == 0 )
                return 0;
        }
    }
    if ( Vec_IntSize(p->vTfo) > 0 )
    {
        assert( p->pPars->nTfoLevMax > 0 );
        assert( Vec_IntSize(p->vRoots) > 0 );
        assert( Vec_IntEntry(p->vTfo, 0) != p->iPivotNode );
        // collect variables of root nodes
        Vec_IntClear( p->vLits );
        Vec_IntForEachEntry( p->vRoots, iNode, i )
            Vec_IntPush( p->vLits, Sfm_ObjSatVar(p, iNode) );
        // assign new variables to the TFO nodes
        Vec_IntForEachEntry( p->vTfo, iNode, i )
        {
            Sfm_ObjCleanSatVar( p, Sfm_ObjSatVar(p, iNode) );
            Sfm_ObjSetSatVar( p, iNode, p->nSatVars++ );
        }
        // add CNF clauses for the TFO
        Vec_IntForEachEntry( p->vTfo, iNode, i )
        {
            assert( Sfm_ObjIsNode(p, iNode) );
            // collect fanin variables
            Vec_IntClear( p->vFaninMap );
            Sfm_ObjForEachFanin( p, iNode, iFanin, k )
                Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iFanin) );
            Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iNode) );
            // generate CNF 
            Sfm_TranslateCnf( p->vClauses, (Vec_Str_t *)Vec_WecEntry(p->vCnfs, iNode), p->vFaninMap, Sfm_ObjSatVar(p, p->iPivotNode) );
            // add clauses
            Vec_WecForEachLevel( p->vClauses, vClause, k )
            {
                if ( Vec_IntSize(vClause) == 0 )
                    break;
                RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause) );
                if ( RetValue == 0 )
                    return 0;
            }
        }
        // create XOR clauses for the roots
        Vec_IntForEachEntry( p->vRoots, iNode, i )
        {
            sat_solver_add_xor( p->pSat, Vec_IntEntry(p->vLits, i), Sfm_ObjSatVar(p, iNode), p->nSatVars++, 0 );
            Vec_IntWriteEntry( p->vLits, i, Abc_Var2Lit(p->nSatVars-1, 0) );
        }
        // make OR clause for the last nRoots variables
        RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(p->vLits), Vec_IntArray(p->vLits) + Vec_IntSize(p->vLits) );
        if ( RetValue == 0 )
            return 0;
    }
    // finalize
    RetValue = sat_solver_simplify( p->pSat );
    p->timeCnf += Abc_Clock() - clk;
    return RetValue;
}